

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack15_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x7fff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0xf & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x1fff) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0xd & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x7ff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0xb & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0x1ff) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 9 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0x7f) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 7 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0x1f) << 10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 5 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 7) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 3 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x12;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 1) << 0xe | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 1 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = *puVar2 >> 0x10 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = *puVar2 >> 0x1f;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0x3fff) << 1 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = *puVar2 >> 0xe & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = *puVar2 >> 0x1d;
  puVar2 = in + 9;
  *puVar1 = (*puVar2 & 0xfff) << 3 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = *puVar2 >> 0xc & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = *puVar2 >> 0x1b;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 0x3ff) << 5 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 10 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = *puVar2 >> 0x19;
  puVar2 = in + 0xb;
  *puVar1 = (*puVar2 & 0xff) << 7 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = *puVar2 >> 8 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = *puVar2 >> 0x17;
  puVar2 = in + 0xc;
  *puVar1 = (*puVar2 & 0x3f) << 9 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = *puVar2 >> 6 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = *puVar2 >> 0x15;
  puVar2 = in + 0xd;
  *puVar1 = (*puVar2 & 0xf) << 0xb | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = *puVar2 >> 4 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = *puVar2 >> 0x13;
  puVar2 = in + 0xe;
  *puVar1 = (*puVar2 & 3) << 0xd | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = *puVar2 >> 2 & 0x7fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1f;
  *puVar1 = *puVar2 >> 0x11;
  *puVar1 = base + *puVar1;
  return in + 0xf;
}

Assistant:

uint32_t * unpack15_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 13 ))<<( 15 - 13 );
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 11 ))<<( 15 - 11 );
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 9 ))<<( 15 - 9 );
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 7 ))<<( 15 - 7 );
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 5 ))<<( 15 - 5 );
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 15 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 15 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 15 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 15 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 15 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 15 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 15 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 15 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 15 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 15 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}